

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

void cppcms::json::traits<char[35]>::set(value *v,vtype *in)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,*in,&local_31);
  json::value::str(v,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

static void set(value &v,vtype const &in)
		{					
			v.str(in);
		}